

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *cctx,ZSTD_EndDirective endOp,size_t inSize)

{
  uint uVar1;
  U64 pledgedSrcSize_00;
  void *local_140;
  void *local_138;
  size_t err_code_1;
  U64 pledgedSrcSize;
  ZSTD_cParamMode_e local_104;
  void *pvStack_100;
  ZSTD_cParamMode_e mode;
  size_t dictSize;
  size_t err_code;
  ZSTD_prefixDict prefixDict;
  ZSTD_CCtx_params params;
  size_t inSize_local;
  ZSTD_EndDirective endOp_local;
  ZSTD_CCtx *cctx_local;
  
  memcpy(&prefixDict.dictContentType,&cctx->requestedParams,0xb0);
  err_code = (size_t)(cctx->prefixDict).dict;
  prefixDict.dict = (void *)(cctx->prefixDict).dictSize;
  prefixDict.dictSize = *(size_t *)&(cctx->prefixDict).dictContentType;
  dictSize = ZSTD_initLocalDict(cctx);
  uVar1 = ERR_isError(dictSize);
  if (uVar1 == 0) {
    memset(&cctx->prefixDict,0,0x18);
    if (endOp == ZSTD_e_end) {
      cctx->pledgedSrcSizePlusOne = inSize + 1;
    }
    if (err_code == 0) {
      if (cctx->cdict == (ZSTD_CDict *)0x0) {
        local_140 = (void *)0x0;
      }
      else {
        local_140 = (void *)cctx->cdict->dictContentSize;
      }
      local_138 = local_140;
    }
    else {
      local_138 = prefixDict.dict;
    }
    pvStack_100 = local_138;
    local_104 = ZSTD_getCParamMode(cctx->cdict,(ZSTD_CCtx_params *)&prefixDict.dictContentType,
                                   cctx->pledgedSrcSizePlusOne - 1);
    ZSTD_getCParamsFromCCtxParams
              ((ZSTD_compressionParameters *)&pledgedSrcSize,
               (ZSTD_CCtx_params *)&prefixDict.dictContentType,cctx->pledgedSrcSizePlusOne - 1,
               (size_t)pvStack_100,local_104);
    stack0xffffffffffffff2c = pledgedSrcSize;
    ZSTD_CParams_shouldEnableLdm((ZSTD_compressionParameters *)&prefixDict.field_0x14);
    ZSTD_CParams_useBlockSplitter((ZSTD_compressionParameters *)&prefixDict.field_0x14);
    ZSTD_resolveRowMatchFinderMode
              (params.validateSequences,(ZSTD_compressionParameters *)&prefixDict.field_0x14);
    pledgedSrcSize_00 = cctx->pledgedSrcSizePlusOne - 1;
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_compressBegin_internal
                           (cctx,(void *)err_code,(size_t)prefixDict.dict,
                            (ZSTD_dictContentType_e)prefixDict.dictSize,ZSTD_dtlm_fast,cctx->cdict,
                            (ZSTD_CCtx_params *)&prefixDict.dictContentType,pledgedSrcSize_00,
                            ZSTDb_buffered);
    uVar1 = ERR_isError((size_t)cctx_local);
    if (uVar1 == 0) {
      cctx->inToCompress = 0;
      cctx->inBuffPos = 0;
      if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
        cctx->inBuffTarget =
             cctx->blockSize + (long)(int)(uint)(cctx->blockSize == pledgedSrcSize_00);
      }
      else {
        cctx->inBuffTarget = 0;
      }
      cctx->outBuffFlushedSize = 0;
      cctx->outBuffContentSize = 0;
      cctx->streamStage = zcss_load;
      cctx->frameEnded = 0;
      cctx_local = (ZSTD_CCtx *)0x0;
    }
  }
  else {
    cctx_local = (ZSTD_CCtx *)dictSize;
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx* cctx,
                                             ZSTD_EndDirective endOp,
                                             size_t inSize) {
    ZSTD_CCtx_params params = cctx->requestedParams;
    ZSTD_prefixDict const prefixDict = cctx->prefixDict;
    FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) , ""); /* Init the local dict if present. */
    ZSTD_memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
    assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
    if (cctx->cdict && !cctx->localDict.cdict) {
        /* Let the cdict's compression level take priority over the requested params.
         * But do not take the cdict's compression level if the "cdict" is actually a localDict
         * generated from ZSTD_initLocalDict().
         */
        params.compressionLevel = cctx->cdict->compressionLevel;
    }
    DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
    if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = inSize + 1;  /* auto-fix pledgedSrcSize */
    {
        size_t const dictSize = prefixDict.dict
                ? prefixDict.dictSize
                : (cctx->cdict ? cctx->cdict->dictContentSize : 0);
        ZSTD_cParamMode_e const mode = ZSTD_getCParamMode(cctx->cdict, &params, cctx->pledgedSrcSizePlusOne - 1);
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &params, cctx->pledgedSrcSizePlusOne-1,
                dictSize, mode);
    }

    if (ZSTD_CParams_shouldEnableLdm(&params.cParams)) {
        /* Enable LDM by default for optimal parser and window size >= 128MB */
        DEBUGLOG(4, "LDM enabled by default (window size >= 128MB, strategy >= btopt)");
        params.ldmParams.enableLdm = 1;
    }

    if (ZSTD_CParams_useBlockSplitter(&params.cParams)) {
        DEBUGLOG(4, "Block splitter enabled by default (window size >= 128K, strategy >= btopt)");
        params.splitBlocks = 1;
    }

    params.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params.useRowMatchFinder, &params.cParams);

#ifdef ZSTD_MULTITHREAD
    if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
        params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
    }
    if (params.nbWorkers > 0) {
#if ZSTD_TRACE
        cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
        /* mt context creation */
        if (cctx->mtctx == NULL) {
            DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                        params.nbWorkers);
            cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem, cctx->pool);
            RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation, "NULL pointer!");
        }
        /* mt compression */
        DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
        FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                    cctx->mtctx,
                    prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                    cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) , "");
        cctx->dictID = cctx->cdict ? cctx->cdict->dictID : 0;
        cctx->dictContentSize = cctx->cdict ? cctx->cdict->dictContentSize : prefixDict.dictSize;
        cctx->consumedSrcSize = 0;
        cctx->producedCSize = 0;
        cctx->streamStage = zcss_load;
        cctx->appliedParams = params;
    } else
#endif
    {   U64 const pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
        assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
        FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType, ZSTD_dtlm_fast,
                cctx->cdict,
                &params, pledgedSrcSize,
                ZSTDb_buffered) , "");
        assert(cctx->appliedParams.nbWorkers == 0);
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        if (cctx->appliedParams.inBufferMode == ZSTD_bm_buffered) {
            /* for small input: avoid automatic flush on reaching end of block, since
            * it would require to add a 3-bytes null block to end frame
            */
            cctx->inBuffTarget = cctx->blockSize + (cctx->blockSize == pledgedSrcSize);
        } else {
            cctx->inBuffTarget = 0;
        }
        cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
    }
    return 0;
}